

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O1

void UI::gather_modeling_interactive(void)

{
  int iVar1;
  bool bVar2;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar2 = false;
  do {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"What would you like to do?","");
    print_ln(&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50," 1 - Append one 2D geofile to another.","");
    print_ln(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70," 2 - Merge two geo files.","");
    print_ln(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130," 3 - Translate entire geo file.","");
    print_ln(&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90," 4 - Rotate entire geo file.","");
    print_ln(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0," 5 - Scale entire geo file.","");
    print_ln(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    skip_ln();
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"Please enter a number followed by return:","");
    print_ln(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    iVar1 = get_choice();
    switch(iVar1) {
    case 1:
      gather_append_interactive();
      break;
    case 2:
      gather_merge_interactive();
      break;
    case 3:
      gather_translate_interactive();
      break;
    case 4:
      gather_rotate_interactive();
      break;
    case 5:
      gather_scale_interactive();
      break;
    default:
      iVar1 = 0xf;
      do {
        skip_ln();
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Unrecognized input","");
      print_ln(&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0010ced7;
    }
    bVar2 = true;
LAB_0010ced7:
    if (bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void UI::gather_modeling_interactive()
{
    bool answered = false;
    while (answered == false)
    {
        print_ln("What would you like to do?");
        print_ln(" 1 - Append one 2D geofile to another.");
        print_ln(" 2 - Merge two geo files.");
        print_ln(" 3 - Translate entire geo file.");
        print_ln(" 4 - Rotate entire geo file.");
        print_ln(" 5 - Scale entire geo file.");
        skip_ln();
        print_ln("Please enter a number followed by return:");
        int choice = get_choice();
        switch (choice)
        {
        case 1:
            gather_append_interactive();
            answered = true;
            break;
        case 2:
            gather_merge_interactive();
            answered = true;
            break;
        case 3:
            gather_translate_interactive();
            answered = true;
            break;
        case 4:
            gather_rotate_interactive();
            answered = true;
            break;
        case 5:
            gather_scale_interactive();
            answered = true;
            break;
        default:
            clear_screen();
            print_ln("Unrecognized input");
            break;
        }
    }
}